

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O3

void insert_region(int start,int last,REGION_TYPES type,REGIONS *regions,int *num_regions,
                  int *cur_region_idx)

{
  REGION_TYPES RVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined4 uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  REGIONS *pRVar12;
  REGIONS *pRVar13;
  int iVar14;
  long lVar15;
  
  iVar8 = *cur_region_idx;
  lVar9 = (long)iVar8;
  RVar1 = regions[lVar9].type;
  iVar11 = regions[lVar9].last;
  uVar10 = (uint)(iVar11 != last) + (uint)(regions[lVar9].start != start);
  iVar14 = *num_regions;
  if (iVar8 < iVar14 + -1) {
    lVar15 = (long)iVar14 + -1;
    pRVar13 = regions + iVar14;
    do {
      pRVar12 = pRVar13 + -1;
      uVar6 = *(undefined4 *)&pRVar13[-1].field_0x34;
      pRVar13[(ulong)uVar10 - 1].type = pRVar13[-1].type;
      *(undefined4 *)&pRVar13[(ulong)uVar10 - 1].field_0x34 = uVar6;
      iVar14 = pRVar12->start;
      iVar7 = pRVar12->last;
      dVar2 = pRVar13[-1].avg_noise_var;
      dVar3 = pRVar13[-1].avg_cor_coeff;
      dVar4 = pRVar13[-1].avg_sr_fr_ratio;
      dVar5 = pRVar13[-1].avg_coded_err;
      pRVar13[(ulong)uVar10 - 1].avg_intra_err = pRVar13[-1].avg_intra_err;
      (&pRVar13[(ulong)uVar10 - 1].avg_intra_err)[1] = dVar5;
      pRVar13[(ulong)uVar10 - 1].avg_cor_coeff = dVar3;
      (&pRVar13[(ulong)uVar10 - 1].avg_cor_coeff)[1] = dVar4;
      pRVar13 = pRVar12 + uVar10;
      pRVar13->start = iVar14;
      pRVar13->last = iVar7;
      pRVar13->avg_noise_var = dVar2;
      lVar15 = lVar15 + -1;
      pRVar13 = pRVar12;
    } while (lVar9 < lVar15);
    iVar14 = *num_regions;
  }
  *num_regions = iVar14 + uVar10;
  if (regions[lVar9].start < start) {
    regions[lVar9].last = start + -1;
    lVar9 = lVar9 + 1;
    regions[lVar9].start = start;
    iVar8 = (int)lVar9;
  }
  regions[lVar9].type = type;
  if (last < iVar11) {
    iVar8 = iVar8 + 1;
    regions[iVar8].start = last + 1;
    regions[iVar8].last = iVar11;
    regions[iVar8].type = RVar1;
    iVar11 = last;
  }
  regions[lVar9].last = iVar11;
  *cur_region_idx = iVar8;
  return;
}

Assistant:

static void insert_region(int start, int last, REGION_TYPES type,
                          REGIONS *regions, int *num_regions,
                          int *cur_region_idx) {
  int k = *cur_region_idx;
  REGION_TYPES this_region_type = regions[k].type;
  int this_region_last = regions[k].last;
  int num_add = (start != regions[k].start) + (last != regions[k].last);
  // move the following regions further to the back
  for (int r = *num_regions - 1; r > k; r--) {
    regions[r + num_add] = regions[r];
  }
  *num_regions += num_add;
  if (start > regions[k].start) {
    regions[k].last = start - 1;
    k++;
    regions[k].start = start;
  }
  regions[k].type = type;
  if (last < this_region_last) {
    regions[k].last = last;
    k++;
    regions[k].start = last + 1;
    regions[k].last = this_region_last;
    regions[k].type = this_region_type;
  } else {
    regions[k].last = this_region_last;
  }
  *cur_region_idx = k;
}